

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::IsParallelogram(ON_NurbsCage *this,double tolerance)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ON_Interval *this_00;
  double dVar10;
  double t;
  double d;
  double t_00;
  double d_00;
  double dVar11;
  double d_01;
  ON_Interval OVar12;
  ON_3dPoint B;
  ON_Interval local_188 [3];
  ON_3dPoint local_150;
  ON_3dPoint Q;
  ON_3dPoint Z;
  ON_3dPoint Y;
  ON_3dPoint X;
  ON_3dPoint P;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  lVar8 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)local_188[0].m_t + lVar8));
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x30);
  uVar9 = 0;
  uVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this);
  this_00 = local_188;
  while ((uVar9 < 3 && ((uVar1 & 1) != 0))) {
    OVar12 = Domain(this,(int)uVar9);
    *&this_00->m_t = OVar12.m_t;
    uVar1 = 0;
    pdVar2 = ON_Interval::operator[](this_00,0);
    if ((*pdVar2 == *this->m_knot[uVar9]) && (!NAN(*pdVar2) && !NAN(*this->m_knot[uVar9]))) {
      pdVar2 = ON_Interval::operator[](this_00,1);
      uVar1 = -(uint)(this->m_knot[uVar9]
                      [(long)this->m_order[uVar9] + (long)this->m_cv_count[uVar9] + -3] == *pdVar2)
              & 1;
    }
    uVar9 = uVar9 + 1;
    this_00 = this_00 + 1;
  }
  lVar8 = 0;
  if ((uVar1 & 1) != 0) {
    GetCV(this,0,0,0,&P);
    iVar7 = this->m_cv_count[0];
    GetCV(this,iVar7 + -1,0,0,&X);
    GetCV(this,0,this->m_cv_count[1] + -1,0,&Y);
    GetCV(this,0,0,this->m_cv_count[2] + -1,&Z);
    lVar6 = lVar8;
    dVar10 = 2.3283064365386963e-10;
    if (2.3283064365386963e-10 <= tolerance) {
      dVar10 = tolerance;
    }
    for (; lVar6 < iVar7; lVar6 = lVar6 + 1) {
      t = ON_GrevilleAbcissa(this->m_order[0],this->m_knot[0] + lVar6);
      d = ON_Interval::NormalizedParameterAt(local_188,t);
      for (lVar3 = 0; lVar3 < this->m_cv_count[1]; lVar3 = lVar3 + 1) {
        t_00 = ON_GrevilleAbcissa(this->m_order[1],this->m_knot[1] + lVar3);
        d_00 = ON_Interval::NormalizedParameterAt(local_188 + 1,t_00);
        lVar4 = -1;
        lVar5 = 0;
        while (lVar4 = lVar4 + 1, lVar4 < this->m_cv_count[2]) {
          dVar11 = ON_GrevilleAbcissa(this->m_order[2],(double *)(lVar5 + (long)this->m_knot[2]));
          d_01 = ON_Interval::NormalizedParameterAt(local_188 + 2,dVar11);
          lVar8 = 0;
          Evaluate(this,t,t_00,dVar11,0,3,&Q.x,0,(int *)0x0);
          ::operator*(&local_78,((1.0 - d) - d_00) - d_01,&P);
          ::operator*(&local_90,d,&X);
          ON_3dPoint::operator+(&local_60,&local_78,&local_90);
          ::operator*(&local_a8,d_00,&Y);
          ON_3dPoint::operator+(&local_48,&local_60,&local_a8);
          ::operator*(&local_c0,d_01,&Z);
          ON_3dPoint::operator+(&local_150,&local_48,&local_c0);
          B.z = local_150.z;
          B.x = local_150.x;
          B.y = local_150.y;
          dVar11 = ON_3dPoint::DistanceTo(&B,&Q);
          lVar5 = lVar5 + 8;
          if (dVar10 < dVar11) goto LAB_0055db52;
        }
      }
      iVar7 = this->m_cv_count[0];
    }
    lVar8 = 1;
  }
LAB_0055db52:
  return SUB81(lVar8,0);
}

Assistant:

bool ON_NurbsCage::IsParallelogram(double tolerance) const
{
  int i,j,k;
  double r,s,t;
  double x,y,z,dist;
  ON_Interval d[3];
  ON_3dPoint P, X, Y, Z, Q, B;

  bool rc = IsValid()?true:false;

  for ( i = 0; i < 3 && rc; i++ )
  {
    d[i] = Domain(i);
    rc = (    d[i][0] == m_knot[i][0]
           && d[i][1] == m_knot[i][m_cv_count[i]+m_order[i]-3]
           );
  }

  if (rc)
  {
    GetCV(0,0,0,P);
    GetCV(m_cv_count[0]-1,0,0,X);
    GetCV(0,m_cv_count[1]-1,0,Y);
    GetCV(0,0,m_cv_count[2]-1,Z);

    if ( tolerance < ON_ZERO_TOLERANCE )
      tolerance = ON_ZERO_TOLERANCE;

    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      r = ON_GrevilleAbcissa(m_order[0],m_knot[0]+i);
      x = d[0].NormalizedParameterAt(r);
      for ( j = 0; j < m_cv_count[1]; j++ )
      {
        s = ON_GrevilleAbcissa(m_order[1],m_knot[1]+j);
        y = d[1].NormalizedParameterAt(s);
        for ( k = 0; k < m_cv_count[2]; k++ )
        {
          t = ON_GrevilleAbcissa(m_order[2],m_knot[2]+k);
          z = d[2].NormalizedParameterAt(t);
          Evaluate(r,s,t,0,3,&Q.x);
          B = (1.0-x-y-z)*P + x*X + y*Y + z*Z;
          dist = B.DistanceTo(Q);
          if ( dist > tolerance )
            return false;          
        }
      }
    }
  }

  return rc;
}